

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O1

int __thiscall jrtplib::RTPSession::SetMaximumPacketSize(RTPSession *this,size_t s)

{
  bool bVar1;
  int iVar2;
  
  iVar2 = -0x3e;
  if (((this->created == true) && (iVar2 = -0x3d, 599 < s)) &&
     (iVar2 = (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1e])
                        (this->rtptrans,s), -1 < iVar2)) {
    iVar2 = RTPPacketBuilder::SetMaximumPacketSize(&this->packetbuilder,s);
    if (-1 < iVar2) {
      bVar1 = (this->rtcpbuilder).init;
      iVar2 = -0x32;
      if (bVar1 == true) {
        (this->rtcpbuilder).maxpacketsize = s;
        iVar2 = 0;
      }
      if (bVar1 != false) {
        this->maxpacksize = s;
        return 0;
      }
      RTPPacketBuilder::SetMaximumPacketSize(&this->packetbuilder,this->maxpacksize);
    }
    (*(this->rtptrans->super_RTPMemoryObject)._vptr_RTPMemoryObject[0x1e])
              (this->rtptrans,this->maxpacksize);
  }
  return iVar2;
}

Assistant:

int RTPSession::SetMaximumPacketSize(size_t s)
{
	if (!created)
		return ERR_RTP_SESSION_NOTCREATED;

	if (s < RTP_MINPACKETSIZE)
		return ERR_RTP_SESSION_MAXPACKETSIZETOOSMALL;
	
	int status;

	if ((status = rtptrans->SetMaximumPacketSize(s)) < 0)
		return status;

	BUILDER_LOCK
	if ((status = packetbuilder.SetMaximumPacketSize(s)) < 0)
	{
		BUILDER_UNLOCK
		// restore previous max packet size
		rtptrans->SetMaximumPacketSize(maxpacksize);
		return status;
	}
	if ((status = rtcpbuilder.SetMaximumPacketSize(s)) < 0)
	{
		// restore previous max packet size
		packetbuilder.SetMaximumPacketSize(maxpacksize);
		BUILDER_UNLOCK
		rtptrans->SetMaximumPacketSize(maxpacksize);
		return status;
	}
	BUILDER_UNLOCK
	maxpacksize = s;
	return 0;
}